

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extend.cpp
# Opt level: O2

void __thiscall CaDiCaL::External::push_clause_literal_on_extension_stack(External *this,int ilit)

{
  int elit;
  value_type_conflict3 local_4;
  
  std::vector<int,_std::allocator<int>_>::push_back(&this->extension,&local_4);
  return;
}

Assistant:

void External::push_clause_literal_on_extension_stack (int ilit) {
  assert (ilit);
  const int elit = internal->externalize (ilit);
  assert (elit);
  extension.push_back (elit);
  LOG ("pushing clause literal %d on extension stack (internal %d)", elit,
       ilit);
}